

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_codepage.cpp
# Opt level: O3

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
read_file<char>(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                *__return_storage_ptr__,basic_istream<char,_std::char_traits<char>_> *in)

{
  long *plVar1;
  char c;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  while( true ) {
    plVar1 = (long *)std::istream::get((char *)in);
    if ((*(byte *)((long)plVar1 + *(long *)(*plVar1 + -0x18) + 0x20) & 5) != 0) break;
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::basic_string<Char> read_file(std::basic_istream<Char> &in)
{
    std::basic_string<Char> res;
    Char c;
    while(in.get(c))
        res+=c;
    return res;
}